

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O1

size_t capnp::anon_unknown_31::findLargestElementBefore<unsigned_int>
                 (Vector<unsigned_int> *vec,uint *key)

{
  uint *puVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  Fault f;
  Fault local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  puVar1 = (vec->builder).ptr;
  lVar4 = (long)(vec->builder).pos - (long)puVar1;
  if ((lVar4 != 0) && (*puVar1 <= *key)) {
    uVar5 = lVar4 >> 2;
    if (uVar5 < 2) {
      uVar3 = 0;
    }
    else {
      uVar3 = 0;
      do {
        uVar2 = uVar3 + uVar5 >> 1;
        uVar6 = uVar2;
        if (puVar1[uVar2] <= *key) {
          uVar6 = uVar5;
          uVar3 = uVar2;
        }
        uVar5 = uVar6;
      } while (1 < uVar6 - uVar3);
    }
    return uVar3;
  }
  local_20.exception = (Exception *)0x0;
  local_18 = 0;
  uStack_10 = 0;
  kj::_::Debug::Fault::init
            (&local_20,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser.c++"
            );
  kj::_::Debug::Fault::fatal(&local_20);
}

Assistant:

kj::Maybe<kj::Own<SchemaFile>> import(kj::StringPtr target) const override {
    if (target.startsWith("/")) {
      auto parsed = kj::Path::parse(target.slice(1));
      for (auto candidate: importPath) {
        KJ_IF_MAYBE(newFile, candidate->tryOpenFile(parsed)) {
          return kj::implicitCast<kj::Own<SchemaFile>>(kj::heap<DiskSchemaFile>(
              *candidate, kj::mv(parsed), importPath, kj::mv(*newFile), nullptr));
        }
      }
      return nullptr;
    } else {
      auto parsed = path.parent().eval(target);

      kj::Maybe<kj::String> displayNameOverride;
      if (displayNameOverridden) {
        // Try to create a consistent display name override for the imported file. This is for
        // backwards-compatibility only -- display names are only overridden when using the
        // deprecated parseDiskFile() interface.
        kj::runCatchingExceptions([&]() {
          displayNameOverride = kj::Path::parse(displayName).parent().eval(target).toString();
        });
      }

      KJ_IF_MAYBE(newFile, baseDir.tryOpenFile(parsed)) {
        return kj::implicitCast<kj::Own<SchemaFile>>(kj::heap<DiskSchemaFile>(
            baseDir, kj::mv(parsed), importPath, kj::mv(*newFile), kj::mv(displayNameOverride)));
      } else {
        return nullptr;
      }
    }
  }